

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_variables.c
# Opt level: O1

ngx_int_t ngx_stream_variable_hostname
                    (ngx_stream_session_t *s,ngx_stream_variable_value_t *v,uintptr_t data)

{
  *(uint *)v = ((uint)(ngx_cycle->hostname).len & 0xfffffff) + (*(uint *)v & 0x80000000) +
               0x10000000;
  v->data = (ngx_cycle->hostname).data;
  return 0;
}

Assistant:

static ngx_int_t
ngx_stream_variable_hostname(ngx_stream_session_t *s,
    ngx_stream_variable_value_t *v, uintptr_t data)
{
    v->len = ngx_cycle->hostname.len;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = ngx_cycle->hostname.data;

    return NGX_OK;
}